

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void fdct8x16_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  __m128i alVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  __m128i alVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i alVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128i alVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  __m128i alVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  __m128i alVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  __m128i alVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  __m128i alVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  __m128i alVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  __m128i alVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  __m128i alVar152;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  longlong local_88;
  longlong lStack_80;
  longlong local_78;
  longlong lStack_70;
  longlong local_68;
  longlong lStack_60;
  longlong local_18;
  longlong lStack_10;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar91 [16];
  undefined1 auVar101 [16];
  undefined1 auVar92 [16];
  undefined1 auVar102 [16];
  undefined1 auVar93 [16];
  undefined1 auVar103 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  
  auVar55 = paddsw((undefined1  [16])*input,(undefined1  [16])input[0xf]);
  auVar23 = psubsw((undefined1  [16])*input,(undefined1  [16])input[0xf]);
  auVar147 = paddsw((undefined1  [16])input[1],(undefined1  [16])input[0xe]);
  auVar10 = psubsw((undefined1  [16])input[1],(undefined1  [16])input[0xe]);
  auVar36 = paddsw((undefined1  [16])input[2],(undefined1  [16])input[0xd]);
  auVar7 = psubsw((undefined1  [16])input[2],(undefined1  [16])input[0xd]);
  auVar11 = paddsw((undefined1  [16])input[3],(undefined1  [16])input[0xc]);
  auVar13 = psubsw((undefined1  [16])input[3],(undefined1  [16])input[0xc]);
  auVar24 = paddsw((undefined1  [16])input[4],(undefined1  [16])input[0xb]);
  auVar64 = psubsw((undefined1  [16])input[4],(undefined1  [16])input[0xb]);
  auVar12 = paddsw((undefined1  [16])input[5],(undefined1  [16])input[10]);
  auVar86 = psubsw((undefined1  [16])input[5],(undefined1  [16])input[10]);
  auVar46 = paddsw((undefined1  [16])input[6],(undefined1  [16])input[9]);
  auVar77 = psubsw((undefined1  [16])input[6],(undefined1  [16])input[9]);
  auVar78 = paddsw((undefined1  [16])input[7],(undefined1  [16])input[8]);
  auVar106 = psubsw((undefined1  [16])input[7],(undefined1  [16])input[8]);
  auVar8 = paddsw(auVar55,auVar78);
  auVar55 = psubsw(auVar55,auVar78);
  auVar134 = paddsw(auVar147,auVar46);
  auVar148 = psubsw(auVar147,auVar46);
  auVar107 = paddsw(auVar36,auVar12);
  auVar12 = psubsw(auVar36,auVar12);
  auVar58._0_12_ = auVar86._0_12_;
  auVar58._12_2_ = auVar86._6_2_;
  auVar58._14_2_ = auVar7._6_2_;
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._0_10_ = auVar86._0_10_;
  auVar57._10_2_ = auVar7._4_2_;
  auVar9._10_6_ = auVar57._10_6_;
  auVar9._0_8_ = auVar86._0_8_;
  auVar9._8_2_ = auVar86._4_2_;
  auVar56._8_8_ = auVar9._8_8_;
  auVar56._6_2_ = auVar7._2_2_;
  auVar56._4_2_ = auVar86._2_2_;
  auVar56._0_2_ = auVar86._0_2_;
  auVar56._2_2_ = auVar7._0_2_;
  auVar87._2_2_ = auVar7._8_2_;
  auVar87._0_2_ = auVar86._8_2_;
  auVar87._4_2_ = auVar86._10_2_;
  auVar87._6_2_ = auVar7._10_2_;
  auVar87._8_2_ = auVar86._12_2_;
  auVar87._10_2_ = auVar7._12_2_;
  auVar87._12_2_ = auVar86._14_2_;
  auVar87._14_2_ = auVar7._14_2_;
  uVar5 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar1 = (long)(int)uVar5 * 0x100;
  iVar2 = 1 << (cos_bit - 1U & 0x1f);
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 0x1e0);
  uVar6 = -uVar4 & 0xffff | uVar4 * 0x10000;
  auVar7._4_4_ = uVar6;
  auVar7._0_4_ = uVar6;
  auVar7._8_4_ = uVar6;
  auVar7._12_4_ = uVar6;
  auVar36 = paddsw(auVar11,auVar24);
  auVar78 = pmaddwd(auVar56,auVar7);
  auVar46 = pmaddwd(auVar87,auVar7);
  auVar9 = ZEXT416(uVar5);
  auVar125._0_4_ = auVar78._0_4_ + iVar2 >> auVar9;
  auVar125._4_4_ = auVar78._4_4_ + iVar2 >> auVar9;
  auVar125._8_4_ = auVar78._8_4_ + iVar2 >> auVar9;
  auVar125._12_4_ = auVar78._12_4_ + iVar2 >> auVar9;
  auVar118._0_4_ = auVar46._0_4_ + iVar2 >> auVar9;
  auVar118._4_4_ = auVar46._4_4_ + iVar2 >> auVar9;
  auVar118._8_4_ = auVar46._8_4_ + iVar2 >> auVar9;
  auVar118._12_4_ = auVar46._12_4_ + iVar2 >> auVar9;
  auVar46 = psubsw(auVar11,auVar24);
  auVar126 = packssdw(auVar125,auVar118);
  iVar3 = (uVar4 & 0xffff) + uVar4 * 0x10000;
  auVar25._4_4_ = iVar3;
  auVar25._0_4_ = iVar3;
  auVar25._8_4_ = iVar3;
  auVar25._12_4_ = iVar3;
  auVar11 = pmaddwd(auVar56,auVar25);
  auVar24 = pmaddwd(auVar87,auVar25);
  auVar59._0_4_ = auVar11._0_4_ + iVar2 >> auVar9;
  auVar59._4_4_ = auVar11._4_4_ + iVar2 >> auVar9;
  auVar59._8_4_ = auVar11._8_4_ + iVar2 >> auVar9;
  auVar59._12_4_ = auVar11._12_4_ + iVar2 >> auVar9;
  auVar88._0_4_ = auVar24._0_4_ + iVar2 >> auVar9;
  auVar88._4_4_ = auVar24._4_4_ + iVar2 >> auVar9;
  auVar88._8_4_ = auVar24._8_4_ + iVar2 >> auVar9;
  auVar88._12_4_ = auVar24._12_4_ + iVar2 >> auVar9;
  auVar78 = packssdw(auVar59,auVar88);
  auVar50._0_12_ = auVar64._0_12_;
  auVar50._12_2_ = auVar64._6_2_;
  auVar50._14_2_ = auVar13._6_2_;
  auVar49._12_4_ = auVar50._12_4_;
  auVar49._0_10_ = auVar64._0_10_;
  auVar49._10_2_ = auVar13._4_2_;
  auVar48._10_6_ = auVar49._10_6_;
  auVar48._0_8_ = auVar64._0_8_;
  auVar48._8_2_ = auVar64._4_2_;
  auVar47._8_8_ = auVar48._8_8_;
  auVar47._6_2_ = auVar13._2_2_;
  auVar47._4_2_ = auVar64._2_2_;
  auVar47._0_2_ = auVar64._0_2_;
  auVar47._2_2_ = auVar13._0_2_;
  auVar65._2_2_ = auVar13._8_2_;
  auVar65._0_2_ = auVar64._8_2_;
  auVar65._4_2_ = auVar64._10_2_;
  auVar65._6_2_ = auVar13._10_2_;
  auVar65._8_2_ = auVar64._12_2_;
  auVar65._10_2_ = auVar13._12_2_;
  auVar65._12_2_ = auVar64._14_2_;
  auVar65._14_2_ = auVar13._14_2_;
  auVar64 = pmaddwd(auVar47,auVar7);
  auVar11 = pmaddwd(auVar65,auVar7);
  auVar13 = pmaddwd(auVar47,auVar25);
  auVar24 = pmaddwd(auVar65,auVar25);
  auVar89._0_4_ = auVar64._0_4_ + iVar2 >> auVar9;
  auVar89._4_4_ = auVar64._4_4_ + iVar2 >> auVar9;
  auVar89._8_4_ = auVar64._8_4_ + iVar2 >> auVar9;
  auVar89._12_4_ = auVar64._12_4_ + iVar2 >> auVar9;
  auVar119._0_4_ = auVar11._0_4_ + iVar2 >> auVar9;
  auVar119._4_4_ = auVar11._4_4_ + iVar2 >> auVar9;
  auVar119._8_4_ = auVar11._8_4_ + iVar2 >> auVar9;
  auVar119._12_4_ = auVar11._12_4_ + iVar2 >> auVar9;
  auVar51._0_4_ = auVar13._0_4_ + iVar2 >> auVar9;
  auVar51._4_4_ = auVar13._4_4_ + iVar2 >> auVar9;
  auVar51._8_4_ = auVar13._8_4_ + iVar2 >> auVar9;
  auVar51._12_4_ = auVar13._12_4_ + iVar2 >> auVar9;
  auVar66._0_4_ = auVar24._0_4_ + iVar2 >> auVar9;
  auVar66._4_4_ = auVar24._4_4_ + iVar2 >> auVar9;
  auVar66._8_4_ = auVar24._8_4_ + iVar2 >> auVar9;
  auVar66._12_4_ = auVar24._12_4_ + iVar2 >> auVar9;
  auVar64 = packssdw(auVar89,auVar119);
  auVar24 = packssdw(auVar51,auVar66);
  auVar119 = paddsw(auVar8,auVar36);
  auVar11 = psubsw(auVar8,auVar36);
  auVar147 = paddsw(auVar134,auVar107);
  auVar135 = psubsw(auVar134,auVar107);
  auVar138._0_12_ = auVar12._0_12_;
  auVar138._12_2_ = auVar12._6_2_;
  auVar138._14_2_ = auVar148._6_2_;
  auVar127._12_4_ = auVar138._12_4_;
  auVar127._0_10_ = auVar12._0_10_;
  auVar127._10_2_ = auVar148._4_2_;
  auVar96._10_6_ = auVar127._10_6_;
  auVar96._0_8_ = auVar12._0_8_;
  auVar96._8_2_ = auVar12._4_2_;
  auVar134._8_8_ = auVar96._8_8_;
  auVar134._6_2_ = auVar148._2_2_;
  auVar134._4_2_ = auVar12._2_2_;
  auVar134._0_2_ = auVar12._0_2_;
  auVar134._2_2_ = auVar148._0_2_;
  auVar37._2_2_ = auVar148._8_2_;
  auVar37._0_2_ = auVar12._8_2_;
  auVar37._4_2_ = auVar12._10_2_;
  auVar37._6_2_ = auVar148._10_2_;
  auVar37._8_2_ = auVar12._12_2_;
  auVar37._10_2_ = auVar148._12_2_;
  auVar37._12_2_ = auVar12._14_2_;
  auVar37._14_2_ = auVar148._14_2_;
  auVar8 = pmaddwd(auVar134,auVar7);
  auVar7 = pmaddwd(auVar7,auVar37);
  auVar12 = pmaddwd(auVar134,auVar25);
  auVar13 = pmaddwd(auVar37,auVar25);
  auVar149._0_4_ = auVar8._0_4_ + iVar2 >> auVar9;
  auVar149._4_4_ = auVar8._4_4_ + iVar2 >> auVar9;
  auVar149._8_4_ = auVar8._8_4_ + iVar2 >> auVar9;
  auVar149._12_4_ = auVar8._12_4_ + iVar2 >> auVar9;
  auVar8._0_4_ = auVar7._0_4_ + iVar2 >> auVar9;
  auVar8._4_4_ = auVar7._4_4_ + iVar2 >> auVar9;
  auVar8._8_4_ = auVar7._8_4_ + iVar2 >> auVar9;
  auVar8._12_4_ = auVar7._12_4_ + iVar2 >> auVar9;
  auVar148._0_4_ = auVar12._0_4_ + iVar2 >> auVar9;
  auVar148._4_4_ = auVar12._4_4_ + iVar2 >> auVar9;
  auVar148._8_4_ = auVar12._8_4_ + iVar2 >> auVar9;
  auVar148._12_4_ = auVar12._12_4_ + iVar2 >> auVar9;
  auVar38._0_4_ = auVar13._0_4_ + iVar2 >> auVar9;
  auVar38._4_4_ = auVar13._4_4_ + iVar2 >> auVar9;
  auVar38._8_4_ = auVar13._8_4_ + iVar2 >> auVar9;
  auVar38._12_4_ = auVar13._12_4_ + iVar2 >> auVar9;
  auVar150 = packssdw(auVar149,auVar8);
  auVar36 = packssdw(auVar148,auVar38);
  auVar86 = paddsw(auVar106,auVar64);
  auVar7 = psubsw(auVar106,auVar64);
  auVar64 = paddsw(auVar77,auVar126);
  auVar107 = psubsw(auVar77,auVar126);
  auVar8 = psubsw(auVar23,auVar24);
  auVar77 = paddsw(auVar24,auVar23);
  auVar127 = psubsw(auVar10,auVar78);
  auVar106 = paddsw(auVar78,auVar10);
  auVar93._0_12_ = auVar119._0_12_;
  auVar93._12_2_ = auVar119._6_2_;
  auVar93._14_2_ = auVar147._6_2_;
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._0_10_ = auVar119._0_10_;
  auVar92._10_2_ = auVar147._4_2_;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._0_8_ = auVar119._0_8_;
  auVar91._8_2_ = auVar119._4_2_;
  auVar90._8_8_ = auVar91._8_8_;
  auVar90._6_2_ = auVar147._2_2_;
  auVar90._4_2_ = auVar119._2_2_;
  auVar90._0_2_ = auVar119._0_2_;
  auVar90._2_2_ = auVar147._0_2_;
  auVar120._2_2_ = auVar147._8_2_;
  auVar120._0_2_ = auVar119._8_2_;
  auVar120._4_2_ = auVar119._10_2_;
  auVar120._6_2_ = auVar147._10_2_;
  auVar120._8_2_ = auVar119._12_2_;
  auVar120._10_2_ = auVar147._12_2_;
  auVar120._12_2_ = auVar119._14_2_;
  auVar120._14_2_ = auVar147._14_2_;
  iVar3 = (uVar4 & 0xffff) + uVar4 * -0x10000;
  auVar10._4_4_ = iVar3;
  auVar10._0_4_ = iVar3;
  auVar10._8_4_ = iVar3;
  auVar10._12_4_ = iVar3;
  auVar13 = pmaddwd(auVar90,auVar25);
  auVar12 = pmaddwd(auVar25,auVar120);
  auVar23 = pmaddwd(auVar90,auVar10);
  auVar10 = pmaddwd(auVar120,auVar10);
  auVar67._0_4_ = auVar13._0_4_ + iVar2 >> auVar9;
  auVar67._4_4_ = auVar13._4_4_ + iVar2 >> auVar9;
  auVar67._8_4_ = auVar13._8_4_ + iVar2 >> auVar9;
  auVar67._12_4_ = auVar13._12_4_ + iVar2 >> auVar9;
  auVar26._0_4_ = auVar12._0_4_ + iVar2 >> auVar9;
  auVar26._4_4_ = auVar12._4_4_ + iVar2 >> auVar9;
  auVar26._8_4_ = auVar12._8_4_ + iVar2 >> auVar9;
  auVar26._12_4_ = auVar12._12_4_ + iVar2 >> auVar9;
  auVar119 = packssdw(auVar67,auVar26);
  auVar94._0_4_ = auVar23._0_4_ + iVar2 >> auVar9;
  auVar94._4_4_ = auVar23._4_4_ + iVar2 >> auVar9;
  auVar94._8_4_ = auVar23._8_4_ + iVar2 >> auVar9;
  auVar94._12_4_ = auVar23._12_4_ + iVar2 >> auVar9;
  auVar121._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar121._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar121._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar121._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  auVar134 = packssdw(auVar94,auVar121);
  local_a8._0_2_ = auVar11._0_2_;
  local_a8._2_2_ = auVar11._2_2_;
  local_a8._4_2_ = auVar11._4_2_;
  local_a8._6_2_ = auVar11._6_2_;
  uStack_a0._0_2_ = auVar11._8_2_;
  uStack_a0._2_2_ = auVar11._10_2_;
  uStack_a0._4_2_ = auVar11._12_2_;
  uStack_a0._6_2_ = auVar11._14_2_;
  auVar23._0_12_ = auVar135._0_12_;
  auVar23._12_2_ = auVar135._6_2_;
  auVar23._14_2_ = local_a8._6_2_;
  auVar13._12_4_ = auVar23._12_4_;
  auVar13._0_10_ = auVar135._0_10_;
  auVar13._10_2_ = local_a8._4_2_;
  auVar12._10_6_ = auVar13._10_6_;
  auVar12._0_8_ = auVar135._0_8_;
  auVar12._8_2_ = auVar135._4_2_;
  auVar11._8_8_ = auVar12._8_8_;
  auVar11._6_2_ = local_a8._2_2_;
  auVar11._4_2_ = auVar135._2_2_;
  auVar11._0_2_ = auVar135._0_2_;
  auVar11._2_2_ = (undefined2)local_a8;
  auVar136._2_2_ = (undefined2)uStack_a0;
  auVar136._0_2_ = auVar135._8_2_;
  auVar136._4_2_ = auVar135._10_2_;
  auVar136._6_2_ = uStack_a0._2_2_;
  auVar136._8_2_ = auVar135._12_2_;
  auVar136._10_2_ = uStack_a0._4_2_;
  auVar136._12_2_ = auVar135._14_2_;
  auVar136._14_2_ = uStack_a0._6_2_;
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 0x220);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar1 + 0x1a0);
  uVar5 = uVar4 & 0xffff | iVar3 * 0x10000;
  auVar79._4_4_ = uVar5;
  auVar79._0_4_ = uVar5;
  auVar79._8_4_ = uVar5;
  auVar79._12_4_ = uVar5;
  uVar5 = uVar4 << 0x10 | -iVar3 & 0xffffU;
  auVar27._4_4_ = uVar5;
  auVar27._0_4_ = uVar5;
  auVar27._8_4_ = uVar5;
  auVar27._12_4_ = uVar5;
  auVar12 = pmaddwd(auVar11,auVar79);
  auVar10 = pmaddwd(auVar136,auVar79);
  auVar11 = pmaddwd(auVar11,auVar27);
  auVar13 = pmaddwd(auVar136,auVar27);
  auVar95._0_4_ = auVar12._0_4_ + iVar2 >> auVar9;
  auVar95._4_4_ = auVar12._4_4_ + iVar2 >> auVar9;
  auVar95._8_4_ = auVar12._8_4_ + iVar2 >> auVar9;
  auVar95._12_4_ = auVar12._12_4_ + iVar2 >> auVar9;
  auVar24._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar24._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar24._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar24._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  auVar68._0_4_ = auVar11._0_4_ + iVar2 >> auVar9;
  auVar68._4_4_ = auVar11._4_4_ + iVar2 >> auVar9;
  auVar68._8_4_ = auVar11._8_4_ + iVar2 >> auVar9;
  auVar68._12_4_ = auVar11._12_4_ + iVar2 >> auVar9;
  auVar137._0_4_ = auVar13._0_4_ + iVar2 >> auVar9;
  auVar137._4_4_ = auVar13._4_4_ + iVar2 >> auVar9;
  auVar137._8_4_ = auVar13._8_4_ + iVar2 >> auVar9;
  auVar137._12_4_ = auVar13._12_4_ + iVar2 >> auVar9;
  auVar96 = packssdw(auVar95,auVar24);
  auVar24 = packssdw(auVar68,auVar137);
  auVar138 = paddsw(auVar46,auVar150);
  auVar147 = psubsw(auVar46,auVar150);
  auVar148 = psubsw(auVar55,auVar36);
  auVar11 = paddsw(auVar36,auVar55);
  auVar78._0_12_ = auVar64._0_12_;
  auVar78._12_2_ = auVar64._6_2_;
  auVar78._14_2_ = auVar106._6_2_;
  auVar55._12_4_ = auVar78._12_4_;
  auVar55._0_10_ = auVar64._0_10_;
  auVar55._10_2_ = auVar106._4_2_;
  auVar46._10_6_ = auVar55._10_6_;
  auVar46._0_8_ = auVar64._0_8_;
  auVar46._8_2_ = auVar64._4_2_;
  auVar36._8_8_ = auVar46._8_8_;
  auVar36._6_2_ = auVar106._2_2_;
  auVar36._4_2_ = auVar64._2_2_;
  auVar36._0_2_ = auVar64._0_2_;
  auVar36._2_2_ = auVar106._0_2_;
  auVar39._2_2_ = auVar106._8_2_;
  auVar39._0_2_ = auVar64._8_2_;
  auVar39._4_2_ = auVar64._10_2_;
  auVar39._6_2_ = auVar106._10_2_;
  auVar39._8_2_ = auVar64._12_2_;
  auVar39._10_2_ = auVar106._12_2_;
  auVar39._12_2_ = auVar64._14_2_;
  auVar39._14_2_ = auVar106._14_2_;
  auVar10 = pmaddwd(auVar36,auVar79);
  auVar12 = pmaddwd(auVar39,auVar79);
  auVar13 = pmaddwd(auVar36,auVar27);
  auVar23 = pmaddwd(auVar39,auVar27);
  auVar52._0_4_ = auVar13._0_4_ + iVar2 >> auVar9;
  auVar52._4_4_ = auVar13._4_4_ + iVar2 >> auVar9;
  auVar52._8_4_ = auVar13._8_4_ + iVar2 >> auVar9;
  auVar52._12_4_ = auVar13._12_4_ + iVar2 >> auVar9;
  auVar97._0_4_ = auVar23._0_4_ + iVar2 >> auVar9;
  auVar97._4_4_ = auVar23._4_4_ + iVar2 >> auVar9;
  auVar97._8_4_ = auVar23._8_4_ + iVar2 >> auVar9;
  auVar97._12_4_ = auVar23._12_4_ + iVar2 >> auVar9;
  auVar13 = packssdw(auVar52,auVar97);
  auVar64._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar64._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar64._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar64._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  auVar40._0_4_ = auVar12._0_4_ + iVar2 >> auVar9;
  auVar40._4_4_ = auVar12._4_4_ + iVar2 >> auVar9;
  auVar40._8_4_ = auVar12._8_4_ + iVar2 >> auVar9;
  auVar40._12_4_ = auVar12._12_4_ + iVar2 >> auVar9;
  auVar10 = packssdw(auVar64,auVar40);
  auVar111._0_12_ = auVar107._0_12_;
  auVar111._12_2_ = auVar107._6_2_;
  auVar111._14_2_ = auVar127._6_2_;
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._0_10_ = auVar107._0_10_;
  auVar110._10_2_ = auVar127._4_2_;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._0_8_ = auVar107._0_8_;
  auVar109._8_2_ = auVar107._4_2_;
  auVar108._8_8_ = auVar109._8_8_;
  auVar108._6_2_ = auVar127._2_2_;
  auVar108._4_2_ = auVar107._2_2_;
  auVar108._0_2_ = auVar107._0_2_;
  auVar108._2_2_ = auVar127._0_2_;
  auVar60._2_2_ = auVar127._8_2_;
  auVar60._0_2_ = auVar107._8_2_;
  auVar60._4_2_ = auVar107._10_2_;
  auVar60._6_2_ = auVar127._10_2_;
  auVar60._8_2_ = auVar107._12_2_;
  auVar60._10_2_ = auVar127._12_2_;
  auVar60._12_2_ = auVar107._14_2_;
  auVar60._14_2_ = auVar127._14_2_;
  iVar3 = (-uVar4 & 0xffff) + iVar3 * -0x10000;
  auVar41._4_4_ = iVar3;
  auVar41._0_4_ = iVar3;
  auVar41._8_4_ = iVar3;
  auVar41._12_4_ = iVar3;
  auVar46 = pmaddwd(auVar108,auVar41);
  auVar12 = pmaddwd(auVar41,auVar60);
  auVar36 = pmaddwd(auVar108,auVar27);
  auVar23 = pmaddwd(auVar60,auVar27);
  auVar122._0_4_ = auVar46._0_4_ + iVar2 >> auVar9;
  auVar122._4_4_ = auVar46._4_4_ + iVar2 >> auVar9;
  auVar122._8_4_ = auVar46._8_4_ + iVar2 >> auVar9;
  auVar122._12_4_ = auVar46._12_4_ + iVar2 >> auVar9;
  auVar42._0_4_ = auVar12._0_4_ + iVar2 >> auVar9;
  auVar42._4_4_ = auVar12._4_4_ + iVar2 >> auVar9;
  auVar42._8_4_ = auVar12._8_4_ + iVar2 >> auVar9;
  auVar42._12_4_ = auVar12._12_4_ + iVar2 >> auVar9;
  auVar112._0_4_ = auVar36._0_4_ + iVar2 >> auVar9;
  auVar112._4_4_ = auVar36._4_4_ + iVar2 >> auVar9;
  auVar112._8_4_ = auVar36._8_4_ + iVar2 >> auVar9;
  auVar112._12_4_ = auVar36._12_4_ + iVar2 >> auVar9;
  auVar61._0_4_ = auVar23._0_4_ + iVar2 >> auVar9;
  auVar61._4_4_ = auVar23._4_4_ + iVar2 >> auVar9;
  auVar61._8_4_ = auVar23._8_4_ + iVar2 >> auVar9;
  auVar61._12_4_ = auVar23._12_4_ + iVar2 >> auVar9;
  auVar78 = packssdw(auVar122,auVar42);
  auVar55 = packssdw(auVar112,auVar61);
  auVar131._0_12_ = auVar138._0_12_;
  auVar131._12_2_ = auVar138._6_2_;
  auVar131._14_2_ = auVar11._6_2_;
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = auVar138._0_10_;
  auVar130._10_2_ = auVar11._4_2_;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = auVar138._0_8_;
  auVar129._8_2_ = auVar138._4_2_;
  auVar128._8_8_ = auVar129._8_8_;
  auVar128._6_2_ = auVar11._2_2_;
  auVar128._4_2_ = auVar138._2_2_;
  auVar128._0_2_ = auVar138._0_2_;
  auVar128._2_2_ = auVar11._0_2_;
  auVar139._2_2_ = auVar11._8_2_;
  auVar139._0_2_ = auVar138._8_2_;
  auVar139._4_2_ = auVar138._10_2_;
  auVar139._6_2_ = auVar11._10_2_;
  auVar139._8_2_ = auVar138._12_2_;
  auVar139._10_2_ = auVar11._12_2_;
  auVar139._12_2_ = auVar138._14_2_;
  auVar139._14_2_ = auVar11._14_2_;
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 0x240);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar1 + 0x180);
  uVar5 = iVar3 << 0x10 | uVar4 & 0xffff;
  auVar126._4_4_ = uVar5;
  auVar126._0_4_ = uVar5;
  auVar126._8_4_ = uVar5;
  auVar126._12_4_ = uVar5;
  uVar4 = uVar4 << 0x10 | -iVar3 & 0xffffU;
  auVar28._4_4_ = uVar4;
  auVar28._0_4_ = uVar4;
  auVar28._8_4_ = uVar4;
  auVar28._12_4_ = uVar4;
  auVar12 = pmaddwd(auVar128,auVar126);
  auVar11 = pmaddwd(auVar126,auVar139);
  auVar23 = pmaddwd(auVar128,auVar28);
  auVar36 = pmaddwd(auVar139,auVar28);
  auVar43._0_4_ = auVar12._0_4_ + iVar2 >> auVar9;
  auVar43._4_4_ = auVar12._4_4_ + iVar2 >> auVar9;
  auVar43._8_4_ = auVar12._8_4_ + iVar2 >> auVar9;
  auVar43._12_4_ = auVar12._12_4_ + iVar2 >> auVar9;
  auVar135._0_4_ = auVar11._0_4_ + iVar2 >> auVar9;
  auVar135._4_4_ = auVar11._4_4_ + iVar2 >> auVar9;
  auVar135._8_4_ = auVar11._8_4_ + iVar2 >> auVar9;
  auVar135._12_4_ = auVar11._12_4_ + iVar2 >> auVar9;
  auVar12 = packssdw(auVar43,auVar135);
  auVar132._0_4_ = auVar23._0_4_ + iVar2 >> auVar9;
  auVar132._4_4_ = auVar23._4_4_ + iVar2 >> auVar9;
  auVar132._8_4_ = auVar23._8_4_ + iVar2 >> auVar9;
  auVar132._12_4_ = auVar23._12_4_ + iVar2 >> auVar9;
  auVar140._0_4_ = auVar36._0_4_ + iVar2 >> auVar9;
  auVar140._4_4_ = auVar36._4_4_ + iVar2 >> auVar9;
  auVar140._8_4_ = auVar36._8_4_ + iVar2 >> auVar9;
  auVar140._12_4_ = auVar36._12_4_ + iVar2 >> auVar9;
  alVar133 = (__m128i)packssdw(auVar132,auVar140);
  auVar144._0_12_ = auVar147._0_12_;
  auVar144._12_2_ = auVar147._6_2_;
  auVar144._14_2_ = auVar148._6_2_;
  auVar143._12_4_ = auVar144._12_4_;
  auVar143._0_10_ = auVar147._0_10_;
  auVar143._10_2_ = auVar148._4_2_;
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._0_8_ = auVar147._0_8_;
  auVar142._8_2_ = auVar147._4_2_;
  auVar141._8_8_ = auVar142._8_8_;
  auVar141._6_2_ = auVar148._2_2_;
  auVar141._4_2_ = auVar147._2_2_;
  auVar141._0_2_ = auVar147._0_2_;
  auVar141._2_2_ = auVar148._0_2_;
  auVar69._2_2_ = auVar148._8_2_;
  auVar69._0_2_ = auVar147._8_2_;
  auVar69._4_2_ = auVar147._10_2_;
  auVar69._6_2_ = auVar148._10_2_;
  auVar69._8_2_ = auVar147._12_2_;
  auVar69._10_2_ = auVar148._12_2_;
  auVar69._12_2_ = auVar147._14_2_;
  auVar69._14_2_ = auVar148._14_2_;
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 0x1c0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar1 + 0x200);
  uVar5 = iVar3 << 0x10 | uVar4 & 0xffff;
  auVar150._4_4_ = uVar5;
  auVar150._0_4_ = uVar5;
  auVar150._8_4_ = uVar5;
  auVar150._12_4_ = uVar5;
  uVar4 = uVar4 << 0x10 | -iVar3 & 0xffffU;
  auVar29._4_4_ = uVar4;
  auVar29._0_4_ = uVar4;
  auVar29._8_4_ = uVar4;
  auVar29._12_4_ = uVar4;
  auVar46 = pmaddwd(auVar141,auVar150);
  auVar11 = pmaddwd(auVar150,auVar69);
  auVar36 = pmaddwd(auVar141,auVar29);
  auVar23 = pmaddwd(auVar69,auVar29);
  auVar151._0_4_ = auVar46._0_4_ + iVar2 >> auVar9;
  auVar151._4_4_ = auVar46._4_4_ + iVar2 >> auVar9;
  auVar151._8_4_ = auVar46._8_4_ + iVar2 >> auVar9;
  auVar151._12_4_ = auVar46._12_4_ + iVar2 >> auVar9;
  auVar14._0_4_ = auVar11._0_4_ + iVar2 >> auVar9;
  auVar14._4_4_ = auVar11._4_4_ + iVar2 >> auVar9;
  auVar14._8_4_ = auVar11._8_4_ + iVar2 >> auVar9;
  auVar14._12_4_ = auVar11._12_4_ + iVar2 >> auVar9;
  alVar152 = (__m128i)packssdw(auVar151,auVar14);
  auVar145._0_4_ = auVar36._0_4_ + iVar2 >> auVar9;
  auVar145._4_4_ = auVar36._4_4_ + iVar2 >> auVar9;
  auVar145._8_4_ = auVar36._8_4_ + iVar2 >> auVar9;
  auVar145._12_4_ = auVar36._12_4_ + iVar2 >> auVar9;
  auVar70._0_4_ = auVar23._0_4_ + iVar2 >> auVar9;
  auVar70._4_4_ = auVar23._4_4_ + iVar2 >> auVar9;
  auVar70._8_4_ = auVar23._8_4_ + iVar2 >> auVar9;
  auVar70._12_4_ = auVar23._12_4_ + iVar2 >> auVar9;
  alVar146 = (__m128i)packssdw(auVar145,auVar70);
  auVar46 = paddsw(auVar86,auVar13);
  auVar36 = psubsw(auVar86,auVar13);
  auVar11 = psubsw(auVar7,auVar78);
  auVar78 = paddsw(auVar78,auVar7);
  auVar23 = paddsw(auVar8,auVar55);
  auVar8 = psubsw(auVar8,auVar55);
  auVar13 = psubsw(auVar77,auVar10);
  auVar7 = paddsw(auVar10,auVar77);
  auVar33._0_12_ = auVar46._0_12_;
  auVar33._12_2_ = auVar46._6_2_;
  auVar33._14_2_ = auVar7._6_2_;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._0_10_ = auVar46._0_10_;
  auVar32._10_2_ = auVar7._4_2_;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_8_ = auVar46._0_8_;
  auVar31._8_2_ = auVar46._4_2_;
  auVar30._8_8_ = auVar31._8_8_;
  auVar30._6_2_ = auVar7._2_2_;
  auVar30._4_2_ = auVar46._2_2_;
  auVar30._0_2_ = auVar46._0_2_;
  auVar30._2_2_ = auVar7._0_2_;
  auVar80._2_2_ = auVar7._8_2_;
  auVar80._0_2_ = auVar46._8_2_;
  auVar80._4_2_ = auVar46._10_2_;
  auVar80._6_2_ = auVar7._10_2_;
  auVar80._8_2_ = auVar46._12_2_;
  auVar80._10_2_ = auVar7._12_2_;
  auVar80._12_2_ = auVar46._14_2_;
  auVar80._14_2_ = auVar7._14_2_;
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar1 + 0x170);
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 0x250);
  uVar5 = iVar3 << 0x10 | uVar4 & 0xffff;
  auVar98._4_4_ = uVar5;
  auVar98._0_4_ = uVar5;
  auVar98._8_4_ = uVar5;
  auVar98._12_4_ = uVar5;
  uVar4 = uVar4 << 0x10 | -iVar3 & 0xffffU;
  auVar113._4_4_ = uVar4;
  auVar113._0_4_ = uVar4;
  auVar113._8_4_ = uVar4;
  auVar113._12_4_ = uVar4;
  auVar10 = pmaddwd(auVar30,auVar98);
  auVar46 = pmaddwd(auVar98,auVar80);
  auVar7 = pmaddwd(auVar30,auVar113);
  auVar44._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar44._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar44._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar44._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  auVar99._0_4_ = auVar46._0_4_ + iVar2 >> auVar9;
  auVar99._4_4_ = auVar46._4_4_ + iVar2 >> auVar9;
  auVar99._8_4_ = auVar46._8_4_ + iVar2 >> auVar9;
  auVar99._12_4_ = auVar46._12_4_ + iVar2 >> auVar9;
  auVar10 = pmaddwd(auVar80,auVar113);
  alVar45 = (__m128i)packssdw(auVar44,auVar99);
  auVar34._0_4_ = auVar7._0_4_ + iVar2 >> auVar9;
  auVar34._4_4_ = auVar7._4_4_ + iVar2 >> auVar9;
  auVar34._8_4_ = auVar7._8_4_ + iVar2 >> auVar9;
  auVar34._12_4_ = auVar7._12_4_ + iVar2 >> auVar9;
  auVar81._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar81._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar81._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar81._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  alVar35 = (__m128i)packssdw(auVar34,auVar81);
  auVar103._0_12_ = auVar36._0_12_;
  auVar103._12_2_ = auVar36._6_2_;
  auVar103._14_2_ = auVar13._6_2_;
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_10_ = auVar36._0_10_;
  auVar102._10_2_ = auVar13._4_2_;
  auVar101._10_6_ = auVar102._10_6_;
  auVar101._0_8_ = auVar36._0_8_;
  auVar101._8_2_ = auVar36._4_2_;
  auVar100._8_8_ = auVar101._8_8_;
  auVar100._6_2_ = auVar13._2_2_;
  auVar100._4_2_ = auVar36._2_2_;
  auVar100._0_2_ = auVar36._0_2_;
  auVar100._2_2_ = auVar13._0_2_;
  auVar86._2_2_ = auVar13._8_2_;
  auVar86._0_2_ = auVar36._8_2_;
  auVar86._4_2_ = auVar36._10_2_;
  auVar86._6_2_ = auVar13._10_2_;
  auVar86._8_2_ = auVar36._12_2_;
  auVar86._10_2_ = auVar13._12_2_;
  auVar86._12_2_ = auVar36._14_2_;
  auVar86._14_2_ = auVar13._14_2_;
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 0x1d0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar1 + 0x1f0);
  uVar5 = iVar3 << 0x10 | uVar4 & 0xffff;
  auVar82._4_4_ = uVar5;
  auVar82._0_4_ = uVar5;
  auVar82._8_4_ = uVar5;
  auVar82._12_4_ = uVar5;
  uVar4 = uVar4 << 0x10 | -iVar3 & 0xffffU;
  auVar114._4_4_ = uVar4;
  auVar114._0_4_ = uVar4;
  auVar114._8_4_ = uVar4;
  auVar114._12_4_ = uVar4;
  auVar10 = pmaddwd(auVar100,auVar82);
  auVar13 = pmaddwd(auVar82,auVar86);
  auVar36 = pmaddwd(auVar100,auVar114);
  auVar7 = pmaddwd(auVar86,auVar114);
  auVar53._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar53._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar53._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar53._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  auVar83._0_4_ = auVar13._0_4_ + iVar2 >> auVar9;
  auVar83._4_4_ = auVar13._4_4_ + iVar2 >> auVar9;
  auVar83._8_4_ = auVar13._8_4_ + iVar2 >> auVar9;
  auVar83._12_4_ = auVar13._12_4_ + iVar2 >> auVar9;
  auVar104._0_4_ = auVar36._0_4_ + iVar2 >> auVar9;
  auVar104._4_4_ = auVar36._4_4_ + iVar2 >> auVar9;
  auVar104._8_4_ = auVar36._8_4_ + iVar2 >> auVar9;
  auVar104._12_4_ = auVar36._12_4_ + iVar2 >> auVar9;
  auVar77._0_4_ = auVar7._0_4_ + iVar2 >> auVar9;
  auVar77._4_4_ = auVar7._4_4_ + iVar2 >> auVar9;
  auVar77._8_4_ = auVar7._8_4_ + iVar2 >> auVar9;
  auVar77._12_4_ = auVar7._12_4_ + iVar2 >> auVar9;
  alVar54 = (__m128i)packssdw(auVar53,auVar83);
  alVar105 = (__m128i)packssdw(auVar104,auVar77);
  local_98 = auVar8._0_2_;
  uStack_96 = auVar8._2_2_;
  uStack_94 = auVar8._4_2_;
  uStack_92 = auVar8._6_2_;
  uStack_90 = auVar8._8_2_;
  uStack_8e = auVar8._10_2_;
  uStack_8c = auVar8._12_2_;
  uStack_8a = auVar8._14_2_;
  auVar74._0_12_ = auVar11._0_12_;
  auVar74._12_2_ = auVar11._6_2_;
  auVar74._14_2_ = uStack_92;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_10_ = auVar11._0_10_;
  auVar73._10_2_ = uStack_94;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._0_8_ = auVar11._0_8_;
  auVar72._8_2_ = auVar11._4_2_;
  auVar71._8_8_ = auVar72._8_8_;
  auVar71._6_2_ = uStack_96;
  auVar71._4_2_ = auVar11._2_2_;
  auVar71._0_2_ = auVar11._0_2_;
  auVar71._2_2_ = local_98;
  auVar15._2_2_ = uStack_90;
  auVar15._0_2_ = auVar11._8_2_;
  auVar15._4_2_ = auVar11._10_2_;
  auVar15._6_2_ = uStack_8e;
  auVar15._8_2_ = auVar11._12_2_;
  auVar15._10_2_ = uStack_8c;
  auVar15._12_2_ = auVar11._14_2_;
  auVar15._14_2_ = uStack_8a;
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 0x210);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar1 + 0x1b0);
  uVar5 = iVar3 << 0x10 | uVar4 & 0xffff;
  auVar115._4_4_ = uVar5;
  auVar115._0_4_ = uVar5;
  auVar115._8_4_ = uVar5;
  auVar115._12_4_ = uVar5;
  uVar4 = uVar4 << 0x10 | -iVar3 & 0xffffU;
  auVar106._4_4_ = uVar4;
  auVar106._0_4_ = uVar4;
  auVar106._8_4_ = uVar4;
  auVar106._12_4_ = uVar4;
  auVar10 = pmaddwd(auVar71,auVar115);
  auVar11 = pmaddwd(auVar115,auVar15);
  auVar8 = pmaddwd(auVar71,auVar106);
  auVar7 = pmaddwd(auVar15,auVar106);
  auVar84._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar84._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar84._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar84._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  auVar116._0_4_ = auVar11._0_4_ + iVar2 >> auVar9;
  auVar116._4_4_ = auVar11._4_4_ + iVar2 >> auVar9;
  auVar116._8_4_ = auVar11._8_4_ + iVar2 >> auVar9;
  auVar116._12_4_ = auVar11._12_4_ + iVar2 >> auVar9;
  alVar85 = (__m128i)packssdw(auVar84,auVar116);
  auVar75._0_4_ = auVar8._0_4_ + iVar2 >> auVar9;
  auVar75._4_4_ = auVar8._4_4_ + iVar2 >> auVar9;
  auVar75._8_4_ = auVar8._8_4_ + iVar2 >> auVar9;
  auVar75._12_4_ = auVar8._12_4_ + iVar2 >> auVar9;
  auVar16._0_4_ = auVar7._0_4_ + iVar2 >> auVar9;
  auVar16._4_4_ = auVar7._4_4_ + iVar2 >> auVar9;
  auVar16._8_4_ = auVar7._8_4_ + iVar2 >> auVar9;
  auVar16._12_4_ = auVar7._12_4_ + iVar2 >> auVar9;
  alVar76 = (__m128i)packssdw(auVar75,auVar16);
  auVar20._0_12_ = auVar78._0_12_;
  auVar20._12_2_ = auVar78._6_2_;
  auVar20._14_2_ = auVar23._6_2_;
  auVar19._12_4_ = auVar20._12_4_;
  auVar19._0_10_ = auVar78._0_10_;
  auVar19._10_2_ = auVar23._4_2_;
  auVar18._10_6_ = auVar19._10_6_;
  auVar18._0_8_ = auVar78._0_8_;
  auVar18._8_2_ = auVar78._4_2_;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._6_2_ = auVar23._2_2_;
  auVar17._4_2_ = auVar78._2_2_;
  auVar17._0_2_ = auVar78._0_2_;
  auVar17._2_2_ = auVar23._0_2_;
  auVar123._2_2_ = auVar23._8_2_;
  auVar123._0_2_ = auVar78._8_2_;
  auVar123._4_2_ = auVar78._10_2_;
  auVar123._6_2_ = auVar23._10_2_;
  auVar123._8_2_ = auVar78._12_2_;
  auVar123._10_2_ = auVar23._12_2_;
  auVar123._12_2_ = auVar78._14_2_;
  auVar123._14_2_ = auVar23._14_2_;
  uVar4 = *(uint *)((long)vert_filter_length_chroma + lVar1 + 400);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar1 + 0x230);
  uVar5 = iVar3 << 0x10 | uVar4 & 0xffff;
  auVar147._4_4_ = uVar5;
  auVar147._0_4_ = uVar5;
  auVar147._8_4_ = uVar5;
  auVar147._12_4_ = uVar5;
  uVar4 = uVar4 << 0x10 | -iVar3 & 0xffffU;
  auVar117._4_4_ = uVar4;
  auVar117._0_4_ = uVar4;
  auVar117._8_4_ = uVar4;
  auVar117._12_4_ = uVar4;
  auVar10 = pmaddwd(auVar17,auVar147);
  auVar7 = pmaddwd(auVar147,auVar123);
  auVar8 = pmaddwd(auVar17,auVar117);
  auVar11 = pmaddwd(auVar123,auVar117);
  auVar62._0_4_ = auVar10._0_4_ + iVar2 >> auVar9;
  auVar62._4_4_ = auVar10._4_4_ + iVar2 >> auVar9;
  auVar62._8_4_ = auVar10._8_4_ + iVar2 >> auVar9;
  auVar62._12_4_ = auVar10._12_4_ + iVar2 >> auVar9;
  auVar107._0_4_ = auVar7._0_4_ + iVar2 >> auVar9;
  auVar107._4_4_ = auVar7._4_4_ + iVar2 >> auVar9;
  auVar107._8_4_ = auVar7._8_4_ + iVar2 >> auVar9;
  auVar107._12_4_ = auVar7._12_4_ + iVar2 >> auVar9;
  auVar21._0_4_ = auVar8._0_4_ + iVar2 >> auVar9;
  auVar21._4_4_ = auVar8._4_4_ + iVar2 >> auVar9;
  auVar21._8_4_ = auVar8._8_4_ + iVar2 >> auVar9;
  auVar21._12_4_ = auVar8._12_4_ + iVar2 >> auVar9;
  alVar63 = (__m128i)packssdw(auVar62,auVar107);
  auVar124._0_4_ = auVar11._0_4_ + iVar2 >> auVar9;
  auVar124._4_4_ = auVar11._4_4_ + iVar2 >> auVar9;
  auVar124._8_4_ = auVar11._8_4_ + iVar2 >> auVar9;
  auVar124._12_4_ = auVar11._12_4_ + iVar2 >> auVar9;
  alVar22 = (__m128i)packssdw(auVar21,auVar124);
  local_68 = auVar119._0_8_;
  lStack_60 = auVar119._8_8_;
  (*output)[0] = local_68;
  (*output)[1] = lStack_60;
  output[1] = alVar45;
  local_88 = auVar12._0_8_;
  lStack_80 = auVar12._8_8_;
  output[2][0] = local_88;
  output[2][1] = lStack_80;
  output[3] = alVar22;
  local_18 = auVar96._0_8_;
  lStack_10 = auVar96._8_8_;
  output[4][0] = local_18;
  output[4][1] = lStack_10;
  output[5] = alVar85;
  output[6] = alVar146;
  output[7] = alVar105;
  local_78 = auVar134._0_8_;
  lStack_70 = auVar134._8_8_;
  output[8][0] = local_78;
  output[8][1] = lStack_70;
  output[9] = alVar54;
  output[10] = alVar152;
  output[0xb] = alVar76;
  local_a8 = auVar24._0_8_;
  uStack_a0 = auVar24._8_8_;
  output[0xc][0] = local_a8;
  output[0xc][1] = uStack_a0;
  output[0xd] = alVar63;
  output[0xe] = alVar133;
  output[0xf] = alVar35;
  return;
}

Assistant:

static void fdct8x16_new_sse2(const __m128i *input, __m128i *output,
                              int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  __m128i cospi_p28_p36 = pair_set_epi16(cospi[28], cospi[36]);
  __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  __m128i cospi_p12_p52 = pair_set_epi16(cospi[12], cospi[52]);
  __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);

  // stage 1
  __m128i x1[16];
  x1[0] = _mm_adds_epi16(input[0], input[15]);
  x1[15] = _mm_subs_epi16(input[0], input[15]);
  x1[1] = _mm_adds_epi16(input[1], input[14]);
  x1[14] = _mm_subs_epi16(input[1], input[14]);
  x1[2] = _mm_adds_epi16(input[2], input[13]);
  x1[13] = _mm_subs_epi16(input[2], input[13]);
  x1[3] = _mm_adds_epi16(input[3], input[12]);
  x1[12] = _mm_subs_epi16(input[3], input[12]);
  x1[4] = _mm_adds_epi16(input[4], input[11]);
  x1[11] = _mm_subs_epi16(input[4], input[11]);
  x1[5] = _mm_adds_epi16(input[5], input[10]);
  x1[10] = _mm_subs_epi16(input[5], input[10]);
  x1[6] = _mm_adds_epi16(input[6], input[9]);
  x1[9] = _mm_subs_epi16(input[6], input[9]);
  x1[7] = _mm_adds_epi16(input[7], input[8]);
  x1[8] = _mm_subs_epi16(input[7], input[8]);

  // stage 2
  __m128i x2[16];
  x2[0] = _mm_adds_epi16(x1[0], x1[7]);
  x2[7] = _mm_subs_epi16(x1[0], x1[7]);
  x2[1] = _mm_adds_epi16(x1[1], x1[6]);
  x2[6] = _mm_subs_epi16(x1[1], x1[6]);
  x2[2] = _mm_adds_epi16(x1[2], x1[5]);
  x2[5] = _mm_subs_epi16(x1[2], x1[5]);
  x2[3] = _mm_adds_epi16(x1[3], x1[4]);
  x2[4] = _mm_subs_epi16(x1[3], x1[4]);
  x2[8] = x1[8];
  x2[9] = x1[9];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x1[10], x1[13], x2[10], x2[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x1[11], x1[12], x2[11], x2[12]);
  x2[14] = x1[14];
  x2[15] = x1[15];

  // stage 3
  __m128i x3[16];
  x3[0] = _mm_adds_epi16(x2[0], x2[3]);
  x3[3] = _mm_subs_epi16(x2[0], x2[3]);
  x3[1] = _mm_adds_epi16(x2[1], x2[2]);
  x3[2] = _mm_subs_epi16(x2[1], x2[2]);
  x3[4] = x2[4];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x2[5], x2[6], x3[5], x3[6]);
  x3[7] = x2[7];
  x3[8] = _mm_adds_epi16(x2[8], x2[11]);
  x3[11] = _mm_subs_epi16(x2[8], x2[11]);
  x3[9] = _mm_adds_epi16(x2[9], x2[10]);
  x3[10] = _mm_subs_epi16(x2[9], x2[10]);
  x3[12] = _mm_subs_epi16(x2[15], x2[12]);
  x3[15] = _mm_adds_epi16(x2[15], x2[12]);
  x3[13] = _mm_subs_epi16(x2[14], x2[13]);
  x3[14] = _mm_adds_epi16(x2[14], x2[13]);

  // stage 4
  __m128i x4[16];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x3[0], x3[1], x4[0], x4[1]);
  btf_16_sse2(cospi_p48_p16, cospi_m16_p48, x3[2], x3[3], x4[2], x4[3]);
  x4[4] = _mm_adds_epi16(x3[4], x3[5]);
  x4[5] = _mm_subs_epi16(x3[4], x3[5]);
  x4[6] = _mm_subs_epi16(x3[7], x3[6]);
  x4[7] = _mm_adds_epi16(x3[7], x3[6]);
  x4[8] = x3[8];
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x3[9], x3[14], x4[9], x4[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x3[10], x3[13], x4[10], x4[13]);
  x4[11] = x3[11];
  x4[12] = x3[12];
  x4[15] = x3[15];

  // stage 5
  __m128i x5[16];
  x5[0] = x4[0];
  x5[1] = x4[1];
  x5[2] = x4[2];
  x5[3] = x4[3];
  btf_16_sse2(cospi_p56_p08, cospi_m08_p56, x4[4], x4[7], x5[4], x5[7]);
  btf_16_sse2(cospi_p24_p40, cospi_m40_p24, x4[5], x4[6], x5[5], x5[6]);
  x5[8] = _mm_adds_epi16(x4[8], x4[9]);
  x5[9] = _mm_subs_epi16(x4[8], x4[9]);
  x5[10] = _mm_subs_epi16(x4[11], x4[10]);
  x5[11] = _mm_adds_epi16(x4[11], x4[10]);
  x5[12] = _mm_adds_epi16(x4[12], x4[13]);
  x5[13] = _mm_subs_epi16(x4[12], x4[13]);
  x5[14] = _mm_subs_epi16(x4[15], x4[14]);
  x5[15] = _mm_adds_epi16(x4[15], x4[14]);

  // stage 6
  __m128i x6[16];
  x6[0] = x5[0];
  x6[1] = x5[1];
  x6[2] = x5[2];
  x6[3] = x5[3];
  x6[4] = x5[4];
  x6[5] = x5[5];
  x6[6] = x5[6];
  x6[7] = x5[7];
  btf_16_sse2(cospi_p60_p04, cospi_m04_p60, x5[8], x5[15], x6[8], x6[15]);
  btf_16_sse2(cospi_p28_p36, cospi_m36_p28, x5[9], x5[14], x6[9], x6[14]);
  btf_16_sse2(cospi_p44_p20, cospi_m20_p44, x5[10], x5[13], x6[10], x6[13]);
  btf_16_sse2(cospi_p12_p52, cospi_m52_p12, x5[11], x5[12], x6[11], x6[12]);

  // stage 7
  output[0] = x6[0];
  output[1] = x6[8];
  output[2] = x6[4];
  output[3] = x6[12];
  output[4] = x6[2];
  output[5] = x6[10];
  output[6] = x6[6];
  output[7] = x6[14];
  output[8] = x6[1];
  output[9] = x6[9];
  output[10] = x6[5];
  output[11] = x6[13];
  output[12] = x6[3];
  output[13] = x6[11];
  output[14] = x6[7];
  output[15] = x6[15];
}